

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainModel.cpp
# Opt level: O3

void __thiscall tiger::trains::models::TrainModel::TrainModel(TrainModel *this)

{
  this->idx = 0;
  this->lineIdx = 0;
  (this->playerIdx)._M_dataplus._M_p = (pointer)&(this->playerIdx).field_2;
  (this->playerIdx)._M_string_length = 0;
  (this->playerIdx).field_2._M_local_buf[0] = '\0';
  (this->eventList).
  super__Vector_base<tiger::trains::models::EventModel,_std::allocator<tiger::trains::models::EventModel>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->eventList).
  super__Vector_base<tiger::trains::models::EventModel,_std::allocator<tiger::trains::models::EventModel>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->eventList).
  super__Vector_base<tiger::trains::models::EventModel,_std::allocator<tiger::trains::models::EventModel>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->position = 0;
  this->speed = STOP;
  this->goodsCapacity = 0;
  this->goods = 0;
  this->goodsType = NONE;
  this->level = 0;
  return;
}

Assistant:

TrainModel::TrainModel()
{
}